

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDFace::ReplaceEdgeInArray
          (ON_SubDFace *this,uint fei0,ON_SubDEdge *edge_to_remove,ON_SubDEdge *edge_to_insert)

{
  uint uVar1;
  ON_SubDEdgePtr *pOVar2;
  
  uVar1 = 0;
  if (this->m_edge_count != 0) {
    pOVar2 = this->m_edge4;
    do {
      if (uVar1 == 4) {
        pOVar2 = this->m_edgex;
      }
      if (uVar1 == 4 && this->m_edgex == (ON_SubDEdgePtr *)0x0) {
        return false;
      }
      if ((fei0 <= uVar1) && ((ON_SubDEdge *)(pOVar2->m_ptr & 0xfffffffffffffff8) == edge_to_remove)
         ) {
        pOVar2->m_ptr = (ulong)((uint)pOVar2->m_ptr & 1) | (ulong)edge_to_insert;
        return true;
      }
      uVar1 = uVar1 + 1;
      pOVar2 = pOVar2 + 1;
    } while (this->m_edge_count != uVar1);
  }
  return false;
}

Assistant:

bool ON_SubDFace::ReplaceEdgeInArray(
  unsigned int fei0,
  ON_SubDEdge* edge_to_remove,
  ON_SubDEdge* edge_to_insert
)
{
  const unsigned int face_edge_count = m_edge_count;
  ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned int fei = 0; fei < face_edge_count; fei++, eptr++)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    if (fei >= fei0 && edge_to_remove == eptr->Edge() )
    {
      const ON__UINT_PTR edir = eptr->EdgeDirection();
      *eptr = ON_SubDEdgePtr::Create(edge_to_insert,edir);
      return true;
    }
  }
  return false;
}